

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O0

uintptr_t mmap_probe_seed(void)

{
  int __fd;
  ssize_t sVar1;
  int ok;
  int fd;
  uintptr_t val;
  uintptr_t local_10 [2];
  
  __fd = open64("/dev/urandom",0);
  if (__fd != -1) {
    sVar1 = read(__fd,local_10,8);
    close(__fd);
    if (sVar1 == 8) {
      return local_10[0];
    }
  }
  return 1;
}

Assistant:

static uintptr_t mmap_probe_seed(void)
{
  uintptr_t val;
  int fd = open("/dev/urandom", O_RDONLY);
  if (fd != -1) {
    int ok = ((size_t)read(fd, &val, sizeof(val)) == sizeof(val));
    (void)close(fd);
    if (ok) return val;
  }
  return 1;  /* Punt. */
}